

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O1

void __thiscall
miniros::IntraProcessSubscriberLink::IntraProcessSubscriberLink
          (IntraProcessSubscriberLink *this,PublicationPtr *parent)

{
  SubscriberLink::SubscriberLink(&this->super_SubscriberLink);
  (this->super_SubscriberLink)._vptr_SubscriberLink =
       (_func_int **)&PTR__IntraProcessSubscriberLink_002abc50;
  *(undefined8 *)((long)&(this->drop_mutex_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->drop_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->drop_mutex_).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->drop_mutex_).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->drop_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->subscriber_).
  super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->subscriber_).
  super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->dropped_ = false;
  (this->drop_mutex_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->super_SubscriberLink).parent_.
  super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_SubscriberLink).parent_.
              super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(parent->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  std::__cxx11::string::_M_assign((string *)&(this->super_SubscriberLink).topic_);
  return;
}

Assistant:

IntraProcessSubscriberLink::IntraProcessSubscriberLink(const PublicationPtr& parent)
: dropped_(false)
{
  MINIROS_ASSERT(parent);
  parent_ = parent;
  topic_ = parent->getName();
}